

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

int tinyformat::detail::convertToInt<char[18],_false>::invoke(char (*param_1) [18])

{
  format_error *this;
  long in_FS_OFFSET;
  allocator<char> local_41;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this = (format_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "tinyformat: Cannot convert from argument type to integer for use as variable width or precision"
             ,&local_41);
  format_error::format_error(this,&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    __cxa_throw(this,&format_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __stack_chk_fail();
}

Assistant:

static int invoke(const T& /*value*/)
    {
        TINYFORMAT_ERROR("tinyformat: Cannot convert from argument type to "
                         "integer for use as variable width or precision");
        return 0;
    }